

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Button.cxx
# Opt level: O3

int __thiscall Fl_Button::handle(Fl_Button *this,int event)

{
  uint *puVar1;
  char cVar2;
  char cVar3;
  uchar uVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  Fl_Window *pFVar9;
  int Y;
  int iVar10;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_30;
  
  iVar7 = 1;
  switch(event) {
  case 1:
    bVar6 = Fl::option(OPTION_VISIBLE_FOCUS);
    if ((bVar6) && (iVar7 = (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6), iVar7 != 0)) {
      Fl::focus(&this->super_Fl_Widget);
    }
  case 5:
    iVar7 = Fl::event_inside(&this->super_Fl_Widget);
    if (iVar7 == 0) {
      puVar1 = &(this->super_Fl_Widget).flags_;
      *(byte *)puVar1 = (byte)*puVar1 & 0x7f;
      uVar8 = (uint)this->oldval;
    }
    else {
      uVar8 = 1;
      if ((this->super_Fl_Widget).type_ != 'f') {
        uVar8 = (uint)(this->oldval == '\0');
      }
    }
    if (uVar8 == (int)this->value_) {
      return 1;
    }
    this->value_ = (char)uVar8;
    puVar1 = &(this->super_Fl_Widget).flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    Fl_Widget::redraw(&this->super_Fl_Widget);
    if (((this->super_Fl_Widget).when_ & 1) == 0) {
      return 1;
    }
LAB_001a95e4:
    Fl_Widget::do_callback
              (&this->super_Fl_Widget,&this->super_Fl_Widget,(this->super_Fl_Widget).user_data_);
    return 1;
  case 2:
    cVar2 = this->value_;
    cVar3 = this->oldval;
    if (cVar2 == cVar3) {
      bVar5 = (this->super_Fl_Widget).when_ & 2;
    }
    else {
      puVar1 = &(this->super_Fl_Widget).flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
      uVar4 = (this->super_Fl_Widget).type_;
      if (uVar4 == '\x01') {
        this->oldval = cVar2;
      }
      else if (uVar4 == 'f') {
        setonly(this);
      }
      else {
        value(this,(int)cVar3);
        puVar1 = &(this->super_Fl_Widget).flags_;
        *(byte *)puVar1 = (byte)*puVar1 | 0x80;
        if (((this->super_Fl_Widget).when_ & 1) != 0) {
          Fl_Widget_Tracker::Fl_Widget_Tracker(&local_30,&this->super_Fl_Widget);
          Fl_Widget::do_callback
                    (&this->super_Fl_Widget,&this->super_Fl_Widget,
                     (this->super_Fl_Widget).user_data_);
          Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_30);
          if (local_30.wp_ == (Fl_Widget *)0x0) {
            return 1;
          }
        }
      }
      bVar5 = (this->super_Fl_Widget).when_ & 4;
    }
    if (bVar5 == 0) {
      return 1;
    }
    goto LAB_001a95e4;
  case 3:
  case 4:
    goto switchD_001a9321_caseD_3;
  case 6:
  case 7:
    bVar6 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (bVar6) {
      if ((this->super_Fl_Widget).box_ != '\0') {
        Fl_Widget::redraw(&this->super_Fl_Widget);
        return 1;
      }
      iVar7 = (this->super_Fl_Widget).x_;
      iVar10 = (this->super_Fl_Widget).y_;
      pFVar9 = Fl_Widget::window(&this->super_Fl_Widget);
      if (pFVar9 == (Fl_Window *)0x0) {
        return 1;
      }
      Y = iVar10 + -1;
      if (iVar10 < 1) {
        Y = 0;
      }
      iVar10 = iVar7 + -1;
      if (iVar7 < 1) {
        iVar10 = 0;
      }
      pFVar9 = Fl_Widget::window(&this->super_Fl_Widget);
      Fl_Widget::damage((Fl_Widget *)pFVar9,0x80,iVar10,Y,(this->super_Fl_Widget).w_ + 2,
                        (this->super_Fl_Widget).h_ + 2);
      return 1;
    }
    break;
  case 8:
    if ((((Fl_Button *)Fl::focus_ == this) && (Fl::e_keysym == 0x20)) &&
       ((Fl::e_state._2_1_ & 0x4d) == 0)) {
      puVar1 = &(this->super_Fl_Widget).flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
LAB_001a9507:
      Fl_Widget_Tracker::Fl_Widget_Tracker(&local_30,&this->super_Fl_Widget);
      uVar4 = (this->super_Fl_Widget).type_;
      if (uVar4 == '\x01') {
        value(this,(uint)(this->value_ == '\0'));
      }
      else {
        if (uVar4 != 'f') {
          simulate_key_action(this);
          goto LAB_001a956e;
        }
        if (this->value_ != '\0') goto LAB_001a956e;
        setonly(this);
      }
      if (((this->super_Fl_Widget).when_ & 1) != 0) {
        Fl_Widget::do_callback
                  (&this->super_Fl_Widget,&this->super_Fl_Widget,(this->super_Fl_Widget).user_data_)
        ;
      }
LAB_001a956e:
      if ((local_30.wp_ != (Fl_Widget *)0x0) && (((this->super_Fl_Widget).when_ & 4) != 0)) {
        Fl_Widget::do_callback
                  (&this->super_Fl_Widget,&this->super_Fl_Widget,(this->super_Fl_Widget).user_data_)
        ;
      }
      Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_30);
      return 1;
    }
    break;
  case 0xc:
    if (this->shortcut_ == 0) {
      iVar7 = Fl_Widget::test_shortcut(&this->super_Fl_Widget);
    }
    else {
      iVar7 = Fl::test_shortcut(this->shortcut_);
    }
    if (iVar7 != 0) {
      bVar6 = Fl::option(OPTION_VISIBLE_FOCUS);
      if ((bVar6) && (iVar7 = (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6), iVar7 != 0)) {
        Fl::focus(&this->super_Fl_Widget);
      }
      goto LAB_001a9507;
    }
  }
  iVar7 = 0;
switchD_001a9321_caseD_3:
  return iVar7;
}

Assistant:

int Fl_Button::handle(int event) {
  int newval;
  switch (event) {
  case FL_ENTER: /* FALLTHROUGH */
  case FL_LEAVE:
//  if ((value_?selection_color():color())==FL_GRAY) redraw();
    return 1;
  case FL_PUSH:
    if (Fl::visible_focus() && handle(FL_FOCUS)) Fl::focus(this);
    /* FALLTHROUGH */
  case FL_DRAG:
    if (Fl::event_inside(this)) {
      if (type() == FL_RADIO_BUTTON) newval = 1;
      else newval = !oldval;
    } else {
      clear_changed();
      newval = oldval;
    }
    if (newval != value_) {
      value_ = newval;
      set_changed();
      redraw();
      if (when() & FL_WHEN_CHANGED) do_callback();
    }
    return 1;
  case FL_RELEASE:
    if (value_ == oldval) {
      if (when() & FL_WHEN_NOT_CHANGED) do_callback();
      return 1;
    }
    set_changed();
    if (type() == FL_RADIO_BUTTON) setonly();
    else if (type() == FL_TOGGLE_BUTTON) oldval = value_;
    else {
      value(oldval);
      set_changed();
      if (when() & FL_WHEN_CHANGED) {
	Fl_Widget_Tracker wp(this);
        do_callback();
        if (wp.deleted()) return 1;
      }
    }
    if (when() & FL_WHEN_RELEASE) do_callback();
    return 1;
  case FL_SHORTCUT:
    if (!(shortcut() ?
	  Fl::test_shortcut(shortcut()) : test_shortcut())) return 0;
    if (Fl::visible_focus() && handle(FL_FOCUS)) Fl::focus(this);
    goto triggered_by_keyboard;
  case FL_FOCUS :
  case FL_UNFOCUS :
    if (Fl::visible_focus()) {
      if (box() == FL_NO_BOX) {
	// Widgets with the FL_NO_BOX boxtype need a parent to
	// redraw, since it is responsible for redrawing the
	// background...
	int X = x() > 0 ? x() - 1 : 0;
	int Y = y() > 0 ? y() - 1 : 0;
	if (window()) window()->damage(FL_DAMAGE_ALL, X, Y, w() + 2, h() + 2);
      } else redraw();
      return 1;
    } else return 0;
    /* NOTREACHED */
  case FL_KEYBOARD :
    if (Fl::focus() == this && Fl::event_key() == ' ' &&
        !(Fl::event_state() & (FL_SHIFT | FL_CTRL | FL_ALT | FL_META))) {
      set_changed();
    triggered_by_keyboard:
      Fl_Widget_Tracker wp(this);
      if (type() == FL_RADIO_BUTTON) {
        if (!value_) {
	  setonly();
	  if (when() & FL_WHEN_CHANGED) do_callback();
        }
      } else if (type() == FL_TOGGLE_BUTTON) {
	value(!value());
	if (when() & FL_WHEN_CHANGED) do_callback();
      } else {
        simulate_key_action();
      }
      if (wp.deleted()) return 1;
      if (when() & FL_WHEN_RELEASE) do_callback();
      return 1;
    }
  default:
    return 0;
  }
}